

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::newCallNoIntercept
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,RpcClient *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint,CallHints hints
          )

{
  uint *puVar1;
  RpcConnectionState *params;
  Connection *params_1;
  void *pvVar2;
  SegmentBuilder *pSVar3;
  CapTableBuilder *pCVar4;
  RpcClient *pRVar5;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,_std::nullptr_t> OVar6;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> local_1e0;
  Maybe<capnp::MessageSize> local_1d0;
  Exception local_1b8;
  
  params = (this->connectionState).ptr;
  if ((params->connection).tag == 1) {
    params_1 = *(Connection **)((long)&(params->connection).field_1 + 0x10);
    puVar1 = &(this->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    local_1e0.disposer = &(this->super_Refcounted).super_Disposer;
    local_1e0.ptr = this;
    OVar6 = kj::
            heap<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,capnp::_::RpcSystemBase::RpcConnectionState&,capnp::_::VatNetworkBase::Connection&,kj::Maybe<capnp::MessageSize>&,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,decltype(nullptr)>>
                      ((kj *)&local_1b8,params,params_1,sizeHint,&local_1e0);
    pRVar5 = local_1e0.ptr;
    if (local_1e0.ptr != (RpcClient *)0x0) {
      local_1e0.ptr = (RpcClient *)0x0;
      (**((Disposer *)&(local_1e0.disposer)->_vptr_Disposer)->_vptr_Disposer)
                (local_1e0.disposer,
                 (_func_int *)
                 ((long)&(pRVar5->super_ClientHook)._vptr_ClientHook +
                 (long)(pRVar5->super_ClientHook)._vptr_ClientHook[-2]),OVar6.ptr);
    }
    pvVar2 = ((RequestHook *)(local_1b8.ownFile.content.size_ + 0x70))->brand;
    *(uint64_t *)((long)pvVar2 + 8) = interfaceId;
    *(uint16_t *)((long)pvVar2 + 4) = methodId;
    *(byte *)((long)pvVar2 + 0x10) =
         (byte)((ushort)hints >> 6) & 4 | (hints.noPromisePipelining & 1U) * '\x02' |
         *(byte *)((long)pvVar2 + 0x10) & 0xf9;
    pSVar3 = (SegmentBuilder *)
             ((RequestHook *)(local_1b8.ownFile.content.size_ + 0x90))->_vptr_RequestHook;
    pCVar4 = (CapTableBuilder *)((RequestHook *)(local_1b8.ownFile.content.size_ + 0x90))->brand;
    (__return_storage_ptr__->super_Builder).builder.pointer =
         (WirePointer *)((RequestHook *)(local_1b8.ownFile.content.size_ + 0xa0))->_vptr_RequestHook
    ;
    (__return_storage_ptr__->super_Builder).builder.segment = pSVar3;
    (__return_storage_ptr__->super_Builder).builder.capTable = pCVar4;
    (__return_storage_ptr__->hook).disposer = (Disposer *)local_1b8.ownFile.content.ptr;
    (__return_storage_ptr__->hook).ptr = (RequestHook *)local_1b8.ownFile.content.size_;
  }
  else {
    kj::Exception::Exception(&local_1b8,(Exception *)&(params->connection).field_1);
    local_1d0.ptr.isSet = (sizeHint->ptr).isSet;
    if (local_1d0.ptr.isSet == true) {
      local_1d0.ptr.field_1.value.wordCount = (sizeHint->ptr).field_1.value.wordCount;
      local_1d0.ptr.field_1._8_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
    }
    newBrokenRequest(__return_storage_ptr__,&local_1b8,&local_1d0);
    kj::Exception::~Exception(&local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCallNoIntercept(
        uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
        CallHints hints) {
      if (!connectionState->connection.is<Connected>()) {
        return newBrokenRequest(kj::cp(connectionState->connection.get<Disconnected>()), sizeHint);
      }

      auto request = kj::heap<RpcRequest>(
          *connectionState, *connectionState->connection.get<Connected>().connection,
          sizeHint, kj::addRef(*this));
      auto callBuilder = request->getCall();

      callBuilder.setInterfaceId(interfaceId);
      callBuilder.setMethodId(methodId);
      callBuilder.setNoPromisePipelining(hints.noPromisePipelining);
      callBuilder.setOnlyPromisePipeline(hints.onlyPromisePipeline);

      auto root = request->getRoot();
      return Request<AnyPointer, AnyPointer>(root, kj::mv(request));
    }